

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

void __thiscall
QCalendarWidgetPrivate::createNavigationBar(QCalendarWidgetPrivate *this,QWidget *widget)

{
  QWidget *this_00;
  QCalendarModel *this_01;
  int iVar1;
  int iVar2;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this_02;
  QToolButton *pQVar3;
  QWidget *pQVar4;
  QMenu *this_03;
  QAction *pQVar5;
  QAction **ppQVar6;
  QSpinBox *pQVar7;
  QSpacerItem *pQVar8;
  QLayout *this_04;
  long in_FS_OFFSET;
  QAnyStringView QVar9;
  QAnyStringView QVar10;
  QAnyStringView QVar11;
  QAnyStringView QVar12;
  QAnyStringView QVar13;
  QAnyStringView QVar14;
  QArrayDataPointer<char16_t> local_78;
  int i;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  this_02.m_data = operator_new(0x28);
  QWidget::QWidget((QWidget *)this_02.m_data,widget,(WindowFlags)0x0);
  this->navBarBackground = (QWidget *)this_02;
  QVar9.m_size = (size_t)"qt_calendar_navigationbar";
  QVar9.field_0.m_data = this_02.m_data;
  QObject::setObjectName(QVar9);
  QWidget::setAutoFillBackground(this->navBarBackground,true);
  QWidget::setBackgroundRole(this->navBarBackground,Highlight);
  pQVar3 = (QToolButton *)operator_new(0x28);
  QtPrivate::QPrevNextCalButton::QPrevNextCalButton
            ((QPrevNextCalButton *)pQVar3,this->navBarBackground);
  this->prevMonth = pQVar3;
  pQVar3 = (QToolButton *)operator_new(0x28);
  QtPrivate::QPrevNextCalButton::QPrevNextCalButton
            ((QPrevNextCalButton *)pQVar3,this->navBarBackground);
  this->nextMonth = pQVar3;
  QToolButton::setAutoRaise(this->prevMonth,true);
  QToolButton::setAutoRaise(this->nextMonth,true);
  QWidget::setSizePolicy((QWidget *)this->prevMonth,(QSizePolicy)0x100000);
  QWidget::setSizePolicy((QWidget *)this->nextMonth,(QSizePolicy)0x100000);
  QToolButton::setAutoRaise(this->nextMonth,true);
  updateButtonIcons(this);
  QAbstractButton::setAutoRepeat(&this->prevMonth->super_QAbstractButton,true);
  QAbstractButton::setAutoRepeat(&this->nextMonth->super_QAbstractButton,true);
  pQVar4 = (QWidget *)operator_new(0x28);
  QtPrivate::QCalToolButton::QCalToolButton((QCalToolButton *)pQVar4,this->navBarBackground);
  this->monthButton = (QCalToolButton *)pQVar4;
  QWidget::setSizePolicy(pQVar4,(QSizePolicy)0x100000);
  QToolButton::setAutoRaise(&this->monthButton->super_QToolButton,true);
  QToolButton::setPopupMode(&this->monthButton->super_QToolButton,InstantPopup);
  this_03 = (QMenu *)operator_new(0x28);
  QMenu::QMenu(this_03,(QWidget *)this->monthButton);
  this->monthMenu = this_03;
  i = 1;
  iVar1 = QCalendar::maximumMonthsInYear();
  iVar2 = 1;
  while (iVar2 <= iVar1) {
    local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    this_01 = this->m_model;
    QWidget::locale((QLocale *)&local_58.shared,this_00);
    QtPrivate::QCalendarModel::monthName((QString *)&local_78,this_01,(QLocale *)&local_58.shared,i)
    ;
    QLocale::~QLocale((QLocale *)&local_58.shared);
    pQVar5 = QWidget::addAction(&this->monthMenu->super_QWidget,(QString *)&local_78);
    ::QVariant::QVariant((QVariant *)&local_58,i);
    QAction::setData((QVariant *)pQVar5);
    ::QVariant::~QVariant((QVariant *)&local_58);
    ppQVar6 = QMap<int,_QAction_*>::operator[](&this->monthToAction,&i);
    *ppQVar6 = pQVar5;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    i = i + 1;
    iVar2 = i;
  }
  QToolButton::setMenu(&this->monthButton->super_QToolButton,this->monthMenu);
  pQVar4 = (QWidget *)operator_new(0x28);
  QtPrivate::QCalToolButton::QCalToolButton((QCalToolButton *)pQVar4,this->navBarBackground);
  this->yearButton = (QCalToolButton *)pQVar4;
  QWidget::setSizePolicy(pQVar4,(QSizePolicy)0x100000);
  QToolButton::setAutoRaise(&this->yearButton->super_QToolButton,true);
  pQVar7 = (QSpinBox *)operator_new(0x28);
  QSpinBox::QSpinBox(pQVar7,this->navBarBackground);
  this->yearEdit = pQVar7;
  local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QFont::QFont((QFont *)local_58.data,&this_00->data->fnt);
  QFont::setWeight((Weight)&local_58);
  QWidget::setFont((QWidget *)this->monthButton,(QFont *)local_58.data);
  QWidget::setFont((QWidget *)this->yearButton,(QFont *)local_58.data);
  QAbstractSpinBox::setFrame((QAbstractSpinBox *)this->yearEdit,false);
  pQVar7 = this->yearEdit;
  iVar2 = QDate::year(&this->m_model->m_minimumDate,*(undefined8 *)&this->m_model->m_calendar);
  QSpinBox::setMinimum(pQVar7,iVar2);
  pQVar7 = this->yearEdit;
  iVar2 = QDate::year(&this->m_model->m_maximumDate,*(undefined8 *)&this->m_model->m_calendar);
  QSpinBox::setMaximum(pQVar7,iVar2);
  QWidget::hide((QWidget *)this->yearEdit);
  pQVar8 = (QSpacerItem *)operator_new(0x28);
  (pQVar8->super_QLayoutItem)._vptr_QLayoutItem = (_func_int **)&PTR__QSpacerItem_007c0cd8;
  *(undefined8 *)&(pQVar8->super_QLayoutItem).align = 0;
  pQVar8->height = 0;
  pQVar8->sizeP = (anon_union_4_2_313b0b05_for_QSizePolicy_1)0x110000;
  (pQVar8->rect).x1 = 0;
  (pQVar8->rect).y1 = 0;
  (pQVar8->rect).x2 = -1;
  (pQVar8->rect).y2 = -1;
  this->spaceHolder = pQVar8;
  this_04 = (QLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout((QHBoxLayout *)this_04);
  local_78.d = (Data *)0x0;
  local_78.ptr = (char16_t *)0x0;
  QLayout::setContentsMargins(this_04,(QMargins *)&local_78);
  (**(code **)(*(long *)this_04 + 0x68))(this_04,0);
  QBoxLayout::addWidget((QBoxLayout *)this_04,(QWidget *)this->prevMonth,0,(Alignment)0x0);
  iVar2 = (**(code **)(*(long *)this_04 + 200))(this_04);
  QBoxLayout::insertStretch((QBoxLayout *)this_04,iVar2,0);
  QBoxLayout::addWidget((QBoxLayout *)this_04,(QWidget *)this->monthButton,0,(Alignment)0x0);
  (**(code **)(*(long *)this_04 + 0x80))(this_04,this->spaceHolder);
  QBoxLayout::addWidget((QBoxLayout *)this_04,(QWidget *)this->yearButton,0,(Alignment)0x0);
  iVar2 = (**(code **)(*(long *)this_04 + 200))(this_04);
  QBoxLayout::insertStretch((QBoxLayout *)this_04,iVar2,0);
  QBoxLayout::addWidget((QBoxLayout *)this_04,(QWidget *)this->nextMonth,0,(Alignment)0x0);
  QWidget::setLayout(this->navBarBackground,this_04);
  QWidget::setFocusPolicy((QWidget *)this->yearEdit,StrongFocus);
  QWidget::setFocusPolicy((QWidget *)this->prevMonth,NoFocus);
  QWidget::setFocusPolicy((QWidget *)this->nextMonth,NoFocus);
  QWidget::setFocusPolicy((QWidget *)this->yearButton,NoFocus);
  QWidget::setFocusPolicy((QWidget *)this->monthButton,NoFocus);
  QVar10.m_size = (size_t)"qt_calendar_prevmonth";
  QVar10.field_0 =
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)this->prevMonth;
  QObject::setObjectName(QVar10);
  QVar11.m_size = (size_t)"qt_calendar_nextmonth";
  QVar11.field_0 =
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)this->nextMonth;
  QObject::setObjectName(QVar11);
  QVar12.m_size = (size_t)"qt_calendar_monthbutton";
  QVar12.field_0 =
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)this->monthButton;
  QObject::setObjectName(QVar12);
  QVar13.m_size = (size_t)"qt_calendar_yearbutton";
  QVar13.field_0 =
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)this->yearButton;
  QObject::setObjectName(QVar13);
  QVar14.m_size = (size_t)"qt_calendar_yearedit";
  QVar14.field_0 =
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)this->yearEdit;
  QObject::setObjectName(QVar14);
  updateMonthMenu(this);
  iVar2 = QDate::year(&this->m_model->m_date,*(undefined8 *)&this->m_model->m_calendar);
  iVar1 = QDate::month(&this->m_model->m_date,*(undefined8 *)&this->m_model->m_calendar);
  showMonth(this,iVar2,iVar1);
  QFont::~QFont((QFont *)local_58.data);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarWidgetPrivate::createNavigationBar(QWidget *widget)
{
    Q_Q(QCalendarWidget);
    navBarBackground = new QWidget(widget);
    navBarBackground->setObjectName("qt_calendar_navigationbar"_L1);
    navBarBackground->setAutoFillBackground(true);
    navBarBackground->setBackgroundRole(QPalette::Highlight);

    prevMonth = new QPrevNextCalButton(navBarBackground);
    nextMonth = new QPrevNextCalButton(navBarBackground);
    prevMonth->setAutoRaise(true);
    nextMonth->setAutoRaise(true);
    prevMonth->setSizePolicy(QSizePolicy::Fixed, QSizePolicy::Minimum);
    nextMonth->setSizePolicy(QSizePolicy::Fixed, QSizePolicy::Minimum);
    nextMonth->setAutoRaise(true);
    updateButtonIcons();
    prevMonth->setAutoRepeat(true);
    nextMonth->setAutoRepeat(true);

    monthButton = new QCalToolButton(navBarBackground);
    monthButton->setSizePolicy(QSizePolicy::Fixed, QSizePolicy::Minimum);
    monthButton->setAutoRaise(true);
    monthButton->setPopupMode(QToolButton::InstantPopup);
    monthMenu = new QMenu(monthButton);
    for (int i = 1, e = m_model->m_calendar.maximumMonthsInYear(); i <= e; i++) {
        QString monthName(m_model->monthName(q->locale(), i));
        QAction *act = monthMenu->addAction(monthName);
        act->setData(i);
        monthToAction[i] = act;
    }
    monthButton->setMenu(monthMenu);
    yearButton = new QCalToolButton(navBarBackground);
    yearButton->setSizePolicy(QSizePolicy::Fixed, QSizePolicy::Minimum);
    yearButton->setAutoRaise(true);
    yearEdit = new QSpinBox(navBarBackground);

    QFont font = q->font();
    font.setBold(true);
    monthButton->setFont(font);
    yearButton->setFont(font);
    yearEdit->setFrame(false);
    yearEdit->setMinimum(m_model->m_minimumDate.year(m_model->m_calendar));
    yearEdit->setMaximum(m_model->m_maximumDate.year(m_model->m_calendar));
    yearEdit->hide();
    spaceHolder = new QSpacerItem(0,0);

    QHBoxLayout *headerLayout = new QHBoxLayout;
    headerLayout->setContentsMargins(QMargins());
    headerLayout->setSpacing(0);
    headerLayout->addWidget(prevMonth);
    headerLayout->insertStretch(headerLayout->count());
    headerLayout->addWidget(monthButton);
    headerLayout->addItem(spaceHolder);
    headerLayout->addWidget(yearButton);
    headerLayout->insertStretch(headerLayout->count());
    headerLayout->addWidget(nextMonth);
    navBarBackground->setLayout(headerLayout);

    yearEdit->setFocusPolicy(Qt::StrongFocus);
    prevMonth->setFocusPolicy(Qt::NoFocus);
    nextMonth->setFocusPolicy(Qt::NoFocus);
    yearButton->setFocusPolicy(Qt::NoFocus);
    monthButton->setFocusPolicy(Qt::NoFocus);

    //set names for the header controls.
    prevMonth->setObjectName("qt_calendar_prevmonth"_L1);
    nextMonth->setObjectName("qt_calendar_nextmonth"_L1);
    monthButton->setObjectName("qt_calendar_monthbutton"_L1);
    yearButton->setObjectName("qt_calendar_yearbutton"_L1);
    yearEdit->setObjectName("qt_calendar_yearedit"_L1);

    updateMonthMenu();
    showMonth(m_model->m_date.year(m_model->m_calendar), m_model->m_date.month(m_model->m_calendar));
}